

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O2

bool __thiscall
solitaire::events::EventsProcessor::checkIfCollidesAndTryPullOutOrUncoverCardsFromTableauPile
          (EventsProcessor *this,PileId *id,MouseLeftButtonDown *event)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  PileId local_28;
  uint local_24;
  
  local_24 = id->t;
  iVar1 = (*this->context->_vptr_Context[8])();
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
                    ((long *)CONCAT44(extraout_var,iVar1),event);
  if ((uVar2 >> 0x20 & 1) != 0) {
    _local_28 = CONCAT44(local_24,id->t);
    tryPullOutOrUncoverCardsFromTableauPile(this,&local_28,event,(uint)uVar2);
  }
  return (bool)((byte)(uVar2 >> 0x20) & 1);
}

Assistant:

bool EventsProcessor::checkIfCollidesAndTryPullOutOrUncoverCardsFromTableauPile(
    const PileId id, const MouseLeftButtonDown& event) const
{
    const auto& collider = context.getTableauPileCollider(id);
    const auto cardIndex = collider.tryGetCollidedCardIndex(event.position);
    if (cardIndex) {
        tryPullOutOrUncoverCardsFromTableauPile(id, event, cardIndex.value());
        return true;
    }
    return false;
}